

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

maybe<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_> * __thiscall
rangeless::fn::impl::
maybe<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::operator=
          (maybe<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
           *this,maybe<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                 *other)

{
  pointer pXVar1;
  bool *pbVar2;
  
  if (this != other) {
    if (other->m_empty == false) {
      reset(this,(vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *)other);
      pbVar2 = &other->m_empty;
      if (*pbVar2 != false) {
        return this;
      }
      pXVar1 = (other->field_0).m_value.
               super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (this->m_empty != false) {
        return this;
      }
      pbVar2 = &this->m_empty;
      pXVar1 = (this->field_0).m_value.
               super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
               _M_impl.super__Vector_impl_data._M_start;
      other = this;
    }
    if (pXVar1 != (pointer)0x0) {
      operator_delete(pXVar1,(long)(other->field_0).m_value.
                                   super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pXVar1
                     );
    }
    *pbVar2 = true;
  }
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }